

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall chrono::ChLinkTSDA::Update(ChLinkTSDA *this,double time,bool update_assets)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  uint uVar4;
  ChBodyFrame *pCVar5;
  double *pdVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  Index size_1;
  Index index_2;
  Index index;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  Index size;
  ulong uVar22;
  Index size_2;
  double *pdVar23;
  ChStateDelta state_w;
  ChState state_x;
  ChStateDelta local_70;
  double local_58;
  ChState local_50;
  long local_38;
  
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime = time;
  local_58 = time;
  ChState::ChState(&local_50,(long)this->m_nstates + 0xe,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_70,(long)this->m_nstates + 0xc,(ChIntegrable *)0x0);
  pCVar5 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&local_50);
  pCVar5 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),7,&local_50);
  pCVar5 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&local_70);
  pCVar5 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar5[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),6,&local_70);
  if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
    uVar22 = (ulong)this->m_nstates;
    if (local_50.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar22 < 0) goto LAB_0059ce6c;
    if ((this->m_nstates < 0) ||
       ((long)(local_50.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar22) < 0xe)) goto LAB_0059ce8b;
    pdVar23 = local_50.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 0xe;
    uVar16 = uVar22;
    if ((((ulong)pdVar23 & 7) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)pdVar23 >> 3) & 0x1fffffff) & 7), uVar22 <= uVar16)) {
      uVar16 = uVar22;
    }
    lVar21 = uVar22 - uVar16;
    iVar7 = (int)lVar21;
    iVar15 = iVar7 + 7;
    if (-1 < iVar7) {
      iVar15 = iVar7;
    }
    lVar17 = (long)(iVar15 >> 3);
    if (uVar16 != 0) {
      memset(pdVar23,0,uVar16 * 8);
    }
    lVar3 = uVar16 + lVar17 * 8;
    local_38 = lVar17;
    if (7 < lVar21) {
      lVar17 = uVar16 + 8;
      if ((long)(uVar16 + 8) < lVar3) {
        lVar17 = lVar3;
      }
      memset(pdVar23 + uVar16,0,(~uVar16 + lVar17 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar3 < (long)uVar22) {
      memset(pdVar23 + local_38 * 8 + uVar16,0,(lVar21 + local_38 * -8) * 8);
    }
    uVar22 = (ulong)this->m_nstates;
    if (local_70.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar22 < 0) goto LAB_0059ce6c;
    if ((this->m_nstates < 0) ||
       ((long)(local_70.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar22) < 0xc)) goto LAB_0059ce8b;
    if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar22) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                   );
    }
    pdVar23 = local_70.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 0xc;
    uVar16 = uVar22;
    if ((((ulong)pdVar23 & 7) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)pdVar23 >> 3) & 0x1fffffff) & 7),
       (long)uVar22 <= (long)uVar16)) {
      uVar16 = uVar22;
    }
    pdVar6 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar19 = uVar22 - uVar16;
    uVar18 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar18 = uVar19;
    }
    if (0 < (long)uVar16) {
      uVar20 = 0;
      do {
        pdVar23[uVar20] = pdVar6[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar16 != uVar20);
    }
    uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar16;
    if (7 < (long)uVar19) {
      do {
        pdVar1 = pdVar6 + uVar16;
        dVar8 = pdVar1[1];
        dVar9 = pdVar1[2];
        dVar10 = pdVar1[3];
        dVar11 = pdVar1[4];
        dVar12 = pdVar1[5];
        dVar13 = pdVar1[6];
        dVar14 = pdVar1[7];
        pdVar2 = pdVar23 + uVar16;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar8;
        pdVar2[2] = dVar9;
        pdVar2[3] = dVar10;
        pdVar2[4] = dVar11;
        pdVar2[5] = dVar12;
        pdVar2[6] = dVar13;
        pdVar2[7] = dVar14;
        uVar16 = uVar16 + 8;
      } while ((long)uVar16 < (long)uVar18);
    }
    if ((long)uVar18 < (long)uVar22) {
      do {
        pdVar23[uVar18] = pdVar6[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar22 != uVar18);
    }
  }
  ComputeQ(this,local_58,&local_50,&local_70,&this->m_Qforce);
  if (this->m_stiff == true) {
    if (this->m_jacobians == (SpringJacobians *)0x0) {
      CreateJacobianMatrices(this);
    }
    ComputeJacobians(this,local_58,&local_50,&local_70);
    pdVar23 = local_70.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar4 = this->m_nstates;
    uVar22 = (ulong)(int)uVar4;
    if (local_70.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar22 < 0) {
LAB_0059ce6c:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    if (((int)uVar4 < 0) ||
       ((long)(local_70.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar22) < 0xc)) {
LAB_0059ce8b:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar22) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 uVar22,1);
      if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows != uVar22) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar6 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar16 = (ulong)(uVar4 & 0x7ffffff8);
    if (7 < uVar4) {
      uVar18 = 0;
      do {
        pdVar2 = pdVar23 + uVar18 + 0xc;
        dVar8 = pdVar2[1];
        dVar9 = pdVar2[2];
        dVar10 = pdVar2[3];
        dVar11 = pdVar2[4];
        dVar12 = pdVar2[5];
        dVar13 = pdVar2[6];
        dVar14 = pdVar2[7];
        pdVar1 = pdVar6 + uVar18;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar8;
        pdVar1[2] = dVar9;
        pdVar1[3] = dVar10;
        pdVar1[4] = dVar11;
        pdVar1[5] = dVar12;
        pdVar1[6] = dVar13;
        pdVar1[7] = dVar14;
        uVar18 = uVar18 + 8;
      } while (uVar18 < uVar16);
    }
    if ((int)(uVar4 & 0x7ffffff8) < (int)uVar4) {
      do {
        pdVar6[uVar16] = pdVar23[uVar16 + 0xc];
        uVar16 = uVar16 + 1;
      } while (uVar22 != uVar16);
    }
  }
  ChPhysicsItem::Update
            ((ChPhysicsItem *)this,
             (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime,
             update_assets);
  if (local_70.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_70.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_50.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_50.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  return;
}

Assistant:

void ChLinkTSDA::Update(double time, bool update_assets) {
    ChTime = time;

    // Pack states and state derivatives for the two connected bodies and ODE states (if present)
    ChState state_x(14 + m_nstates, nullptr);
    ChStateDelta state_w(12 + m_nstates, nullptr);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_x(0, state_x);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_x(7, state_x);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_w(0, state_w);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_w(6, state_w);

    if (m_variables) {
        state_x.segment(14, m_nstates).setZero();
        state_w.segment(12, m_nstates) = m_states;
    }

    // Compute forcing terms at current states (this also updates link kinematics)
    ComputeQ(time, state_x, state_w, m_Qforce);

    // Compute Jacobians (if needed)
    if (m_stiff) {
        if (!m_jacobians)
            CreateJacobianMatrices();
        // Compute Jacobian matrices
        ComputeJacobians(time, state_x, state_w);
        // Restore the states (may have been perturbed during Jacobian calculation)
        m_states = state_w.segment(12, m_nstates);
    }

    // Update assets
    ChPhysicsItem::Update(ChTime, update_assets);
}